

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O0

void __thiscall
fmt::v5::basic_writer<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>_>_>::
int_writer<unsigned_long,_fmt::v5::basic_format_specs<char>_>::on_num
          (int_writer<unsigned_long,_fmt::v5::basic_format_specs<char>_> *this)

{
  num_writer f;
  basic_format_specs<char> *in_stack_00000030;
  uint in_stack_0000003c;
  basic_writer<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>_>_>
  *in_stack_00000040;
  string_view in_stack_00000048;
  uint size;
  char_type sep;
  uint num_digits;
  undefined8 in_stack_00000068;
  unique_ptr<fmt::v5::locale_provider,_std::default_delete<fmt::v5::locale_provider>_>
  *in_stack_ffffffffffffffa0;
  undefined4 in_stack_ffffffffffffffd0;
  undefined4 in_stack_ffffffffffffffd4;
  
  internal::count_digits((uint64_t)in_stack_ffffffffffffffa0);
  std::unique_ptr<fmt::v5::locale_provider,_std::default_delete<fmt::v5::locale_provider>_>::get
            (in_stack_ffffffffffffffa0);
  internal::thousands_sep<char>
            ((locale_provider *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0));
  get_prefix((int_writer<unsigned_long,_fmt::v5::basic_format_specs<char>_> *)0x14a640);
  f._8_8_ = in_stack_00000068;
  f.abs_value = (unsigned_type)this;
  basic_writer<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>>>::
  write_int<fmt::v5::basic_format_specs<char>,fmt::v5::basic_writer<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>>>::int_writer<unsigned_long,fmt::v5::basic_format_specs<char>>::num_writer>
            (in_stack_00000040,in_stack_0000003c,in_stack_00000048,in_stack_00000030,f);
  return;
}

Assistant:

void on_num() {
      unsigned num_digits = internal::count_digits(abs_value);
      char_type sep = internal::thousands_sep<char_type>(writer.locale_.get());
      unsigned size = num_digits + SEP_SIZE * ((num_digits - 1) / 3);
      writer.write_int(size, get_prefix(), spec,
                       num_writer{abs_value, size, sep});
    }